

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_line_base.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
assert_line_base(assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_type cVar1;
  char_class_type cVar2;
  cpp_regex_traits<char> *in_RSI;
  char (*in_RDI) [8];
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *unaff_retaddr;
  
  cVar2 = lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,8ul>
                    (unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  *(char_class_type *)*in_RDI = cVar2;
  cVar1 = cpp_regex_traits<char>::widen(in_RSI,(char)((ulong)in_RDI >> 0x38));
  (*in_RDI)[2] = cVar1;
  cVar1 = cpp_regex_traits<char>::widen(in_RSI,(char)((ulong)in_RDI >> 0x38));
  (*in_RDI)[3] = cVar1;
  return;
}

Assistant:

assert_line_base(Traits const &tr)
            : newline_(lookup_classname(tr, "newline"))
            , nl_(tr.widen('\n'))
            , cr_(tr.widen('\r'))
        {
        }